

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O2

bool character_equip_oneslot(Character *character,short item,uchar subloc,EquipLocation slot)

{
  int iVar1;
  ulong uVar2;
  undefined7 in_register_00000011;
  
  uVar2 = CONCAT71(in_register_00000011,subloc) & 0xffffffff;
  iVar1 = (character->paperdoll)._M_elems[uVar2];
  if (iVar1 == 0) {
    (character->paperdoll)._M_elems[uVar2] = (int)item;
    Character::DelItem(character,item,1);
    Character::CalculateStats(character,true);
  }
  return iVar1 == 0;
}

Assistant:

static bool character_equip_oneslot(Character *character, short item, unsigned char subloc, Character::EquipLocation slot)
{
	(void)subloc;

	if (character->paperdoll[slot] != 0)
	{
		return false;
	}

	character->paperdoll[slot] = item;
	character->DelItem(item, 1);

	character->CalculateStats();
	return true;
}